

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::textureLookupFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLookups,
          ConditionalUsage conditionalUsage,ConditionalType conditionalType)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int local_c8;
  allocator<char> local_c1;
  Performance *local_c0;
  int numLookups_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  numLookups_local = (int)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_c0 = this;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER && numLookups != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  for (local_b0._M_dataplus._M_p._0_4_ = 0; (int)local_b0._M_dataplus._M_p < (int)local_c0;
      local_b0._M_dataplus._M_p._0_4_ = (int)local_b0._M_dataplus._M_p + 1) {
    de::toString<int>(&local_90,(int *)&local_b0);
    std::operator+(&local_70,"uniform sampler2D u_sampler",&local_90);
    std::operator+(&local_50,&local_70,"${NAME_SPEC};\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (numLookups != 0 && conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar4 = (char *)0x0;
  pcVar2 = "v_condition${NAME_SPEC} > 0.0";
  if (conditionalUsage != CONDITIONAL_USAGE_EVERY_OTHER) {
    pcVar2 = pcVar4;
  }
  pcVar3 = "u_condition${NAME_SPEC} > 0.0";
  if (conditionalUsage != CONDITIONAL_USAGE_FIRST_HALF) {
    pcVar3 = pcVar2;
  }
  pcVar2 = "1.0 > 0.0";
  if (conditionalUsage != CONDITIONAL_USAGE_NONE) {
    pcVar2 = pcVar3;
  }
  if (numLookups == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_c8);
    std::operator+(&local_90,&local_b0,"\tif (");
    std::operator+(&local_70,&local_90,pcVar2);
    std::operator+(&local_50,&local_70,")\n\t{\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  iVar1 = (int)local_c0;
  while( true ) {
    local_c8 = (int)pcVar4;
    if ((int)local_c0 <= local_c8) break;
    if (numLookups == 1) {
      if (local_c8 < (iVar1 + 1) / 2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    else if ((numLookups == 2) && (((ulong)pcVar4 & 1) == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,&local_c1);
      std::operator+(&local_90,&local_b0,"\tif (");
      std::operator+(&local_70,&local_90,pcVar2);
      std::operator+(&local_50,&local_70,")\n\t");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    de::toString<int>(&local_90,&local_c8);
    std::operator+(&local_70,"\tcolor += texture(u_sampler",&local_90);
    std::operator+(&local_50,&local_70,"${NAME_SPEC}, v_coords${NAME_SPEC});\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    if ((numLookups == 1) && (local_c8 == (iVar1 + -1) / 2)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pcVar4 = (char *)(ulong)(local_c8 + 1);
  }
  de::toString<int>(&local_b0,&numLookups_local);
  std::operator+(&local_90,"\to_color = color/",&local_b0);
  std::operator+(&local_70,&local_90,".0 + ${FLOAT01};\n");
  std::operator+(&local_50,&local_70,"${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

static string textureLookupFragmentTemplate (int numLookups, ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC)
		resultTemplate +=
			"in mediump float v_condition${NAME_SPEC};\n";

	for (int i = 0; i < numLookups; i++)
		resultTemplate +=
			"uniform sampler2D u_sampler" + de::toString(i) + "${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_UNIFORM)
		resultTemplate +=
			"uniform mediump float u_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	mediump vec4 color = vec4(0.0);\n";

	const char* conditionalTerm = conditionalType == CONDITIONAL_TYPE_STATIC	? "1.0 > 0.0"
								: conditionalType == CONDITIONAL_TYPE_UNIFORM	? "u_condition${NAME_SPEC} > 0.0"
								: conditionalType == CONDITIONAL_TYPE_DYNAMIC	? "v_condition${NAME_SPEC} > 0.0"
								: DE_NULL;

	DE_ASSERT(conditionalTerm != DE_NULL);

	if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		resultTemplate += string("") +
			"	if (" + conditionalTerm + ")\n"
			"	{\n";

	for (int i = 0; i < numLookups; i++)
	{
		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		{
			if (i < (numLookups + 1) / 2)
				resultTemplate += "\t";
		}
		else if (conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER)
		{
			if (i % 2 == 0)
				resultTemplate += string("") +
					"	if (" + conditionalTerm + ")\n"
					"\t";
		}

		resultTemplate +=
			"	color += texture(u_sampler" + de::toString(i) + "${NAME_SPEC}, v_coords${NAME_SPEC});\n";

		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF && i == (numLookups - 1) / 2)
			resultTemplate += "\t}\n";
	}

	resultTemplate +=
		"	o_color = color/" + de::toString(numLookups) + ".0 + ${FLOAT01};\n" +
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}